

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASEParser.cpp
# Opt level: O0

void __thiscall Assimp::ASE::Parser::Parser(Parser *this,char *szFile,uint fileFormatDefault)

{
  ai_real aVar1;
  uint fileFormatDefault_local;
  char *szFile_local;
  Parser *this_local;
  
  aiColor3D::aiColor3D(&this->m_clrBackground);
  aiColor3D::aiColor3D(&this->m_clrAmbient);
  std::vector<Assimp::ASE::Material,_std::allocator<Assimp::ASE::Material>_>::vector
            (&this->m_vMaterials);
  std::vector<Assimp::ASE::Mesh,_std::allocator<Assimp::ASE::Mesh>_>::vector(&this->m_vMeshes);
  std::vector<Assimp::ASE::Dummy,_std::allocator<Assimp::ASE::Dummy>_>::vector(&this->m_vDummies);
  std::vector<Assimp::ASE::Light,_std::allocator<Assimp::ASE::Light>_>::vector(&this->m_vLights);
  std::vector<Assimp::ASE::Camera,_std::allocator<Assimp::ASE::Camera>_>::vector(&this->m_vCameras);
  if (szFile != (char *)0x0) {
    this->filePtr = szFile;
    this->iFileFormat = fileFormatDefault;
    aVar1 = get_qnan();
    (this->m_clrBackground).r = aVar1;
    aVar1 = get_qnan();
    (this->m_clrAmbient).r = aVar1;
    this->iLineNumber = 0;
    this->iFirstFrame = 0;
    this->iLastFrame = 0;
    this->iFrameSpeed = 0x1e;
    this->iTicksPerFrame = 1;
    this->bLastWasEndLine = false;
    return;
  }
  __assert_fail("__null != szFile",
                "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/ASE/ASEParser.cpp"
                ,0x7b,"Assimp::ASE::Parser::Parser(const char *, unsigned int)");
}

Assistant:

Parser::Parser (const char* szFile, unsigned int fileFormatDefault)
{
    ai_assert(NULL != szFile);
    filePtr = szFile;
    iFileFormat = fileFormatDefault;

    // make sure that the color values are invalid
    m_clrBackground.r = get_qnan();
    m_clrAmbient.r    = get_qnan();

    // setup some default values
    iLineNumber = 0;
    iFirstFrame = 0;
    iLastFrame = 0;
    iFrameSpeed = 30;        // use 30 as default value for this property
    iTicksPerFrame = 1;      // use 1 as default value for this property
    bLastWasEndLine = false; // need to handle \r\n seqs due to binary file mapping
}